

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmap.c
# Opt level: O2

void remove_rooms(level *lev,int lx,int ly,int hx,int hy)

{
  ulong uVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  undefined1 *puVar6;
  long lVar7;
  uint *puVar8;
  ulong uVar9;
  mkroom *__dest;
  
  uVar1 = (ulong)(uint)lev->nroom;
  while (uVar9 = uVar1, 0 < (int)uVar9) {
    uVar1 = uVar9 - 1;
    iVar4 = (int)lev->rooms[uVar1 & 0xffffffff].hx;
    if (lx <= iVar4) {
      __dest = lev->rooms + (uVar1 & 0xffffffff);
      if ((__dest->lx < hx) && (ly <= __dest->hy)) {
        if (__dest->ly < hy) {
          if ((((__dest->hy < hy) && (iVar4 < hx)) && (lx <= __dest->lx)) && (ly <= __dest->ly)) {
            uVar3 = lev->nroom;
            lev->nroom = uVar3 - 1;
            if (uVar9 != uVar3) {
              memcpy(__dest,lev->doors + (long)(int)uVar3 * 0x6c + 0xc,0xd8);
              iVar4 = lev->nroom;
              lVar5 = (long)__dest->lx;
              cVar2 = __dest->hx;
              puVar6 = &lev->locations[lVar5][0].field_0x6;
              for (; lVar5 <= cVar2; lVar5 = lVar5 + 1) {
                lVar7 = (long)__dest->ly;
                puVar8 = (uint *)(puVar6 + lVar7 * 0xc);
                for (; lVar7 <= __dest->hy; lVar7 = lVar7 + 1) {
                  if ((*puVar8 >> 0x10 & 0x3f) == iVar4 + 3U) {
                    *puVar8 = *puVar8 & 0xffc0ffff | (int)uVar1 * 0x10000 + 0x30000U & 0x3f0000;
                  }
                  puVar8 = puVar8 + 3;
                }
                puVar6 = puVar6 + 0xfc;
              }
            }
            lev->doors[(long)(int)uVar3 * 0x6c + 0xc].y = -1;
          }
          else if (__dest->irregular == '\0') {
            impossible("regular room in joined map");
          }
        }
      }
    }
  }
  return;
}

Assistant:

void remove_rooms(struct level *lev, int lx, int ly, int hx, int hy)
{
    int i;
    struct mkroom *croom;

    for (i = lev->nroom - 1; i >= 0; --i) {
	croom = &lev->rooms[i];
	if (croom->hx < lx || croom->lx >= hx ||
	    croom->hy < ly || croom->ly >= hy) continue; /* no overlap */

	if (croom->lx < lx || croom->hx >= hx ||
	    croom->ly < ly || croom->hy >= hy) { /* partial overlap */
	    /* TODO: ensure remaining parts of room are still joined */

	    if (!croom->irregular) impossible("regular room in joined map");
	} else {
	    /* total overlap, remove the room */
	    remove_room(lev, (unsigned)i);
	}
    }
}